

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushID(char *str_id_begin,char *str_id_end)

{
  ImGuiWindow *this;
  uint *puVar1;
  ImGuiID IVar2;
  int iVar3;
  uint *__dest;
  int iVar4;
  int iVar5;
  
  this = GImGui->CurrentWindow;
  IVar2 = ImGuiWindow::GetID(this,str_id_begin,str_id_end);
  iVar3 = (this->IDStack).Size;
  if (iVar3 == (this->IDStack).Capacity) {
    if (iVar3 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar3 / 2 + iVar3;
    }
    iVar5 = iVar3 + 1;
    if (iVar3 + 1 < iVar4) {
      iVar5 = iVar4;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar5 << 2,GImAllocatorUserData);
    puVar1 = (this->IDStack).Data;
    if (puVar1 != (uint *)0x0) {
      memcpy(__dest,puVar1,(long)(this->IDStack).Size << 2);
      puVar1 = (this->IDStack).Data;
      if (puVar1 != (uint *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(puVar1,GImAllocatorUserData);
    }
    (this->IDStack).Data = __dest;
    (this->IDStack).Capacity = iVar5;
    iVar3 = (this->IDStack).Size;
  }
  else {
    __dest = (this->IDStack).Data;
  }
  __dest[iVar3] = IVar2;
  (this->IDStack).Size = (this->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushID(const char* str_id_begin, const char* str_id_end)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    window->IDStack.push_back(window->GetID(str_id_begin, str_id_end));
}